

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O2

parser * init_parse_vault(void)

{
  parser *p;
  
  p = parser_new();
  parser_setpriv(p,(void *)0x0);
  parser_reg(p,"name str name",parse_vault_name);
  parser_reg(p,"type str type",parse_vault_type);
  parser_reg(p,"rating int rating",parse_vault_rating);
  parser_reg(p,"rows uint height",parse_vault_rows);
  parser_reg(p,"columns uint width",parse_vault_columns);
  parser_reg(p,"min-depth uint min_lev",parse_vault_min_depth);
  parser_reg(p,"max-depth uint max_lev",parse_vault_max_depth);
  parser_reg(p,"flags str flags",parse_vault_flags);
  parser_reg(p,"D str text",parse_vault_d);
  return p;
}

Assistant:

struct parser *init_parse_vault(void) {
	struct parser *p = parser_new();
	parser_setpriv(p, NULL);
	parser_reg(p, "name str name", parse_vault_name);
	parser_reg(p, "type str type", parse_vault_type);
	parser_reg(p, "rating int rating", parse_vault_rating);
	parser_reg(p, "rows uint height", parse_vault_rows);
	parser_reg(p, "columns uint width", parse_vault_columns);
	parser_reg(p, "min-depth uint min_lev", parse_vault_min_depth);
	parser_reg(p, "max-depth uint max_lev", parse_vault_max_depth);
	parser_reg(p, "flags str flags", parse_vault_flags);
	parser_reg(p, "D str text", parse_vault_d);
	return p;
}